

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  Schema SVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t id;
  unsigned_long i;
  long lVar5;
  bool bVar6;
  Reader superclass;
  Reader superclasses;
  Schema local_c0;
  StructReader local_b8;
  PointerReader local_88;
  ListReader local_68;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  if (uVar1 < 0x40) {
    SVar2.raw = (this->super_Schema).raw;
    if ((Schema)SVar2.raw == other.super_Schema.raw) {
      bVar3 = true;
    }
    else {
      local_68.ptr = (byte *)(SVar2.raw)->generic->encodedNode;
      local_68.segment = (SegmentReader *)0x0;
      local_68.capTable = (CapTableReader *)0x0;
      local_68.elementCount = 0x7fffffff;
      bVar3 = false;
      _::PointerReader::getStruct(&local_b8,(PointerReader *)&local_68,(word *)0x0);
      local_88.pointer = local_b8.pointers + 4;
      if (local_b8.pointerCount < 5) {
        local_b8.segment._0_4_ = 0;
        local_b8.segment._4_4_ = 0;
        local_b8.capTable._0_4_ = 0;
        local_b8.capTable._4_4_ = 0;
        local_b8.nestingLimit = 0x7fffffff;
        local_88.pointer = (WirePointer *)0x0;
      }
      local_88.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,local_b8.segment._0_4_);
      local_88.capTable._0_4_ = local_b8.capTable._0_4_;
      local_88.capTable._4_4_ = local_b8.capTable._4_4_;
      local_88.nestingLimit = local_b8.nestingLimit;
      _::PointerReader::getList(&local_68,&local_88,INLINE_COMPOSITE,(word *)0x0);
      uVar4 = (ulong)local_68.elementCount;
      if (uVar4 != 0) {
        lVar5 = 0;
        do {
          _::ListReader::getStructElement(&local_b8,&local_68,(ElementCount)lVar5);
          if (local_b8.dataSize < 0x40) {
            id = 0;
          }
          else {
            id = *local_b8.data;
          }
          local_c0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)lVar5 | 0x4000000);
          local_88.segment = (SegmentReader *)Schema::asInterface(&local_c0);
          bVar3 = extends((InterfaceSchema *)&local_88,other,counter);
        } while ((!bVar3) && (bVar6 = uVar4 - 1 != lVar5, lVar5 = lVar5 + 1, bVar6));
      }
    }
  }
  else {
    extends();
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}